

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O2

void __thiscall
QRasterPaintEngine::drawPixmap(QRasterPaintEngine *this,QRectF *r,QPixmap *pixmap,QRectF *sr)

{
  QPaintEngineState *pQVar1;
  bool bVar2;
  int iVar3;
  TransformationType TVar4;
  QRasterBuffer *this_00;
  QPaintEngineState *pQVar5;
  QRasterBuffer *this_01;
  QImage *__return_storage_ptr__;
  int *this_02;
  long in_FS_OFFSET;
  QColor QVar6;
  undefined1 local_c8 [24];
  QSize local_b0;
  QSizeF local_a8;
  undefined1 local_98 [16];
  QImageData *local_88;
  qreal qStack_80;
  undefined1 local_78 [16];
  qreal local_68;
  QColorSpace QStack_60;
  undefined1 local_58 [16];
  QImageData *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (QRasterBuffer *)r;
  this_00 = (QRasterBuffer *)QPixmap::handle(pixmap);
  if (this_00->m_height == 0) {
    this_02 = &this_00->bytes_per_pixel;
    iVar3 = QImage::depth((QImage *)this_02);
    if (iVar3 != 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        (*(this->super_QPaintEngineEx).super_QPaintEngine._vptr_QPaintEngine[0x13])
                  (this,r,this_02,sr,0);
        return;
      }
      goto LAB_003742ad;
    }
    pQVar1 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
    pQVar5 = pQVar1 + -2;
    if (pQVar1 == (QPaintEngineState *)0x0) {
      pQVar5 = (QPaintEngineState *)0x0;
    }
    TVar4 = QTransform::type((QTransform *)(pQVar5 + 0x36));
    if (1 < (int)TVar4) {
LAB_00374236:
      QVar6 = QPen::color((QPen *)(pQVar5 + 0x10));
      local_58._0_14_ = QVar6._0_14_;
      __return_storage_ptr__ = (QImage *)local_98;
      QRasterBuffer::colorizeBitmap
                (__return_storage_ptr__,this_01,(QImage *)this_02,(QColor *)local_58);
      (*(this->super_QPaintEngineEx).super_QPaintEngine._vptr_QPaintEngine[0x13])
                (this,r,__return_storage_ptr__,sr,0);
      goto LAB_00374283;
    }
    local_98._0_8_ = r->w;
    local_98._8_8_ = r->h;
    local_58 = *(undefined1 (*) [16])&sr->w;
    this_01 = (QRasterBuffer *)local_58;
    bVar2 = qFuzzyCompare((QSizeF *)local_98,(QSizeF *)this_01);
    if (!bVar2) goto LAB_00374236;
    local_c8._0_8_ = r->w;
    local_c8._8_8_ = r->h;
    local_78._0_8_ = QPixmap::size(pixmap);
    this_01 = (QRasterBuffer *)local_78;
    bVar2 = ::comparesEqual((QSizeF *)local_c8,(QSize *)this_01);
    if (!bVar2) goto LAB_00374236;
    ensurePen(this);
    local_98._0_8_ = *(double *)(pQVar5 + 0x42) + r->xp;
    local_98._8_8_ = *(double *)(pQVar5 + 0x44) + r->yp;
    drawBitmap(this,(QPointF *)local_98,(QImage *)this_02,(QSpanData *)(pQVar5 + 0x72));
  }
  else {
    local_98 = QRectF::toAlignedRect();
    local_58 = (undefined1  [16])QPixmap::rect(pixmap);
    local_78 = QRect::operator&((QRect *)local_98,(QRect *)local_58);
    local_48 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)this_00 + 0x90))((QImage *)local_58,this_00,local_78);
    local_98._0_8_ = sr->xp + (double)-local_78._0_4_;
    local_98._8_8_ = sr->yp + (double)-local_78._4_4_;
    local_88 = (QImageData *)sr->w;
    qStack_80 = sr->h;
    iVar3 = QImage::depth((QImage *)local_58);
    if (iVar3 == 1) {
      pQVar1 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
      pQVar5 = pQVar1 + -2;
      if (pQVar1 == (QPaintEngineState *)0x0) {
        pQVar5 = (QPaintEngineState *)0x0;
      }
      TVar4 = QTransform::type((QTransform *)(pQVar5 + 0x36));
      if ((int)TVar4 < 2) {
        local_c8._0_8_ = r->w;
        local_c8._8_8_ = r->h;
        local_68 = sr->w;
        QStack_60.d_ptr.d.ptr = (QExplicitlySharedDataPointer<QColorSpacePrivate>)sr->h;
        this_00 = (QRasterBuffer *)&local_68;
        bVar2 = qFuzzyCompare((QSizeF *)local_c8,(QSizeF *)this_00);
        if (bVar2) {
          local_a8.wd = r->w;
          local_a8.ht = r->h;
          local_b0 = QPixmap::size(pixmap);
          this_00 = (QRasterBuffer *)&local_b0;
          bVar2 = ::comparesEqual(&local_a8,(QSize *)this_00);
          if (!bVar2) goto LAB_0037418f;
          ensurePen(this);
          local_c8._0_8_ = *(double *)(pQVar5 + 0x42) + r->xp;
          local_c8._8_8_ = *(double *)(pQVar5 + 0x44) + r->yp;
          __return_storage_ptr__ = (QImage *)local_58;
          drawBitmap(this,(QPointF *)local_c8,__return_storage_ptr__,(QSpanData *)(pQVar5 + 0x72));
          goto LAB_00374283;
        }
      }
LAB_0037418f:
      QVar6 = QPen::color((QPen *)(pQVar5 + 0x10));
      local_68 = QVar6._0_8_;
      QStack_60.d_ptr.d.ptr._0_6_ = QVar6.ct._4_6_;
      QRasterBuffer::colorizeBitmap
                ((QImage *)local_c8,this_00,(QImage *)local_58,(QColor *)&local_68);
      (*(this->super_QPaintEngineEx).super_QPaintEngine._vptr_QPaintEngine[0x13])
                (this,r,(QImage *)local_c8,local_98,0);
      QImage::~QImage((QImage *)local_c8);
    }
    else {
      (*(this->super_QPaintEngineEx).super_QPaintEngine._vptr_QPaintEngine[0x13])
                (this,r,local_58,local_98,0);
    }
    __return_storage_ptr__ = (QImage *)local_58;
LAB_00374283:
    QImage::~QImage(__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_003742ad:
  __stack_chk_fail();
}

Assistant:

void QRasterPaintEngine::drawPixmap(const QRectF &r, const QPixmap &pixmap, const QRectF &sr)
{
#ifdef QT_DEBUG_DRAW
    qDebug() << " - QRasterPaintEngine::drawPixmap(), r=" << r << " sr=" << sr << " pixmap=" << pixmap.size() << "depth=" << pixmap.depth();
#endif

    QPlatformPixmap* pd = pixmap.handle();
    if (pd->classId() == QPlatformPixmap::RasterClass) {
        const QImage &image = static_cast<QRasterPlatformPixmap *>(pd)->image;
        if (image.depth() == 1) {
            Q_D(QRasterPaintEngine);
            QRasterPaintEngineState *s = state();
            if (s->matrix.type() <= QTransform::TxTranslate
                && r.size() == sr.size()
                && r.size() == pixmap.size()) {
                ensurePen();
                drawBitmap(r.topLeft() + QPointF(s->matrix.dx(), s->matrix.dy()), image, &s->penData);
                return;
            } else {
                drawImage(r, d->rasterBuffer->colorizeBitmap(image, s->pen.color()), sr);
            }
        } else {
            drawImage(r, image, sr);
        }
    } else {
        QRect clippedSource = sr.toAlignedRect().intersected(pixmap.rect());
        const QImage image = pd->toImage(clippedSource);
        QRectF translatedSource = sr.translated(-clippedSource.topLeft());
        if (image.depth() == 1) {
            Q_D(QRasterPaintEngine);
            QRasterPaintEngineState *s = state();
            if (s->matrix.type() <= QTransform::TxTranslate
                && r.size() == sr.size()
                && r.size() == pixmap.size()) {
                ensurePen();
                drawBitmap(r.topLeft() + QPointF(s->matrix.dx(), s->matrix.dy()), image, &s->penData);
                return;
            } else {
                drawImage(r, d->rasterBuffer->colorizeBitmap(image, s->pen.color()), translatedSource);
            }
        } else {
            drawImage(r, image, translatedSource);
        }
    }
}